

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O1

int rep0_pipe_init(void *arg,nni_pipe *pipe,void *s)

{
  uint32_t uVar1;
  
  nni_aio_init((nni_aio *)((long)arg + 0x18),rep0_pipe_send_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x1e0),rep0_pipe_recv_cb,arg);
  nni_list_init_offset((nni_list *)((long)arg + 0x3b8),0x28);
  uVar1 = nni_pipe_id(pipe);
  *(uint32_t *)((long)arg + 0x10) = uVar1;
  *(nni_pipe **)arg = pipe;
  *(void **)((long)arg + 8) = s;
  return 0;
}

Assistant:

static int
rep0_pipe_init(void *arg, nni_pipe *pipe, void *s)
{
	rep0_pipe *p = arg;

	nni_aio_init(&p->aio_send, rep0_pipe_send_cb, p);
	nni_aio_init(&p->aio_recv, rep0_pipe_recv_cb, p);

	NNI_LIST_INIT(&p->sendq, rep0_ctx, sqnode);

	p->id   = nni_pipe_id(pipe);
	p->pipe = pipe;
	p->rep  = s;
	return (0);
}